

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_extent_ralloc_large_shrink(tsdn_t *tsdn,arena_t *arena,extent_t *extent,size_t oldusize)

{
  arena_t *arena_00;
  size_t usize;
  
  arena_00 = *(arena_t **)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  arena_large_dalloc_stats_update((tsdn_t *)arena,(arena_t *)oldusize,(size_t)sz_index2size_tab);
  arena_large_malloc_stats_update((tsdn_t *)arena,arena_00,usize);
  LOCK();
  (arena->nactive).repr = (arena->nactive).repr - (oldusize - (long)arena_00 >> 0xc);
  UNLOCK();
  return;
}

Assistant:

void
arena_extent_ralloc_large_shrink(tsdn_t *tsdn, arena_t *arena, extent_t *extent,
    size_t oldusize) {
	size_t usize = extent_usize_get(extent);
	size_t udiff = oldusize - usize;

	if (config_stats) {
		arena_stats_lock(tsdn, &arena->stats);
		arena_large_ralloc_stats_update(tsdn, arena, oldusize, usize);
		arena_stats_unlock(tsdn, &arena->stats);
	}
	arena_nactive_sub(arena, udiff >> LG_PAGE);
}